

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YuvImageProcessor.cpp
# Opt level: O0

void MMXProcessor(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  ulong uVar6;
  void *pvVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int bi_1;
  int gi_1;
  int ri_1;
  __m64 val_1;
  int vv;
  int uu;
  int yy;
  __m64 vi_1;
  __m64 ui_1;
  __m64 yi_1;
  __m64 rgb;
  int offset;
  int j_1;
  int i_1;
  int a;
  int num;
  int bi;
  int gi;
  int ri;
  __m64 val;
  int bb;
  int gg;
  int rr;
  __m64 b;
  __m64 g;
  __m64 r;
  __m64 yuv;
  uint8_t vi;
  uint8_t ui;
  uint8_t yi;
  int j;
  int i;
  __m64 *data;
  char local_96c;
  char local_968;
  int local_964;
  char local_960;
  int local_95c;
  char local_958;
  uint local_954;
  uint local_950;
  uint local_94c;
  uint local_948;
  int local_944;
  ushort local_940;
  int local_798;
  int local_794;
  ushort local_790;
  int local_78c;
  int local_600;
  int local_5fc;
  int local_3d0;
  int local_3c0;
  int local_3b0;
  int local_370;
  int local_360;
  int local_350;
  int iStack_30c;
  int iStack_2fc;
  int iStack_2ec;
  int iStack_2ac;
  int iStack_29c;
  int iStack_28c;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)size;
  uVar6 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar6);
  for (local_5fc = 0; local_5fc < 0x438; local_5fc = local_5fc + 1) {
    for (local_600 = 0; local_600 < 0x780; local_600 = local_600 + 1) {
      auVar1 = vpinsrw_avx(ZEXT216(0x10),0x80,1);
      auVar1 = vpinsrw_avx(auVar1,0x80,2);
      auVar1 = vpinsrw_avx(auVar1,0,3);
      auVar3 = vpinsrw_avx(ZEXT116((byte)y[local_5fc][local_600]),
                           (uint)(byte)u[local_5fc / 2][local_600 / 2],1);
      auVar3 = vpinsrw_avx(auVar3,(uint)(byte)v[local_5fc / 2][local_600 / 2],2);
      auVar3 = vpinsrw_avx(auVar3,0,3);
      uVar10 = CONCAT26(auVar3._6_2_ - auVar1._6_2_,
                        CONCAT24(auVar3._4_2_ - auVar1._4_2_,
                                 CONCAT22(auVar3._2_2_ - auVar1._2_2_,auVar3._0_2_ - auVar1._0_2_)))
      ;
      auVar1 = vpinsrw_avx(ZEXT216(0x12a),0,1);
      auVar1 = vpinsrw_avx(auVar1,0x199,2);
      auVar1 = vpinsrw_avx(auVar1,0,3);
      uVar8 = pmaddwd(uVar10,auVar1._0_8_);
      auVar1 = vpinsrw_avx(ZEXT216(0x12a),0xff9c,1);
      auVar1 = vpinsrw_avx(auVar1,0xff30,2);
      auVar1 = vpinsrw_avx(auVar1,0,3);
      uVar9 = pmaddwd(uVar10,auVar1._0_8_);
      auVar1 = vpinsrw_avx(ZEXT216(0x12a),0x204,1);
      auVar1 = vpinsrw_avx(auVar1,0,2);
      auVar1 = vpinsrw_avx(auVar1,0,3);
      uVar10 = pmaddwd(uVar10,auVar1._0_8_);
      local_350 = (int)uVar8;
      iStack_28c = (int)((ulong)uVar8 >> 0x20);
      local_360 = (int)uVar9;
      iStack_29c = (int)((ulong)uVar9 >> 0x20);
      local_370 = (int)uVar10;
      iStack_2ac = (int)((ulong)uVar10 >> 0x20);
      local_370 = local_370 + iStack_2ac;
      auVar1 = vpinsrd_avx(ZEXT416((uint)(local_350 + iStack_28c)),local_360 + iStack_29c,1);
      auVar3 = vpinsrd_avx(ZEXT416(0x80),0x80,1);
      local_944 = auVar1._0_4_ + auVar3._0_4_ >> 8;
      local_94c = auVar1._4_4_ + auVar3._4_4_ >> 8;
      if (local_944 < 0) {
        local_940 = 0;
      }
      else {
        if (0xff < local_944) {
          local_944 = 0xff;
        }
        local_940 = (ushort)local_944;
      }
      if ((int)local_94c < 0) {
        local_948 = 0;
      }
      else {
        if (0xff < (int)local_94c) {
          local_94c = 0xff;
        }
        local_948 = local_94c;
      }
      if (local_370 + 0x80 >> 8 < 0) {
        local_950 = 0;
      }
      else {
        if (local_370 + 0x80 >> 8 < 0x100) {
          local_954 = local_370 + 0x80 >> 8;
        }
        else {
          local_954 = 0xff;
        }
        local_950 = local_954;
      }
      auVar1 = vpinsrw_avx(ZEXT216(local_940),local_948 & 0xffff,1);
      auVar1 = vpinsrw_avx(auVar1,local_950 & 0xffff,2);
      auVar1 = vpinsrw_avx(auVar1,0,3);
      *(long *)((long)pvVar7 + (long)(local_5fc * 0x780 + local_600) * 8) = auVar1._0_8_;
    }
  }
  for (local_78c = 0; local_78c < 0x55; local_78c = local_78c + 1) {
    uVar4 = local_78c * 3 + 1;
    for (local_794 = 0; local_794 < 0x438; local_794 = local_794 + 1) {
      for (local_798 = 0; local_798 < 0x780; local_798 = local_798 + 1) {
        iVar5 = local_794 * 0x780 + local_798;
        uVar10 = *(undefined8 *)((long)pvVar7 + (long)iVar5 * 8);
        local_790 = (ushort)uVar4;
        auVar1 = vpinsrw_avx(ZEXT216(local_790),uVar4 & 0xffff,1);
        auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,2);
        auVar1 = vpinsrw_avx(auVar1,uVar4 & 0xffff,3);
        uVar10 = CONCAT26((ushort)((short)((ulong)uVar10 >> 0x30) * auVar1._6_2_) >> 8,
                          CONCAT24((ushort)((short)((ulong)uVar10 >> 0x20) * auVar1._4_2_) >> 8,
                                   CONCAT22((ushort)((short)((ulong)uVar10 >> 0x10) * auVar1._2_2_)
                                            >> 8,(ushort)((short)uVar10 * auVar1._0_2_) >> 8)));
        auVar1 = vpinsrw_avx(ZEXT216(0x42),0x81,1);
        auVar1 = vpinsrw_avx(auVar1,0x19,2);
        auVar1 = vpinsrw_avx(auVar1,0,3);
        uVar8 = pmaddwd(uVar10,auVar1._0_8_);
        auVar1 = vpinsrw_avx(ZEXT216(0xffda),0xffb6,1);
        auVar1 = vpinsrw_avx(auVar1,0x70,2);
        auVar1 = vpinsrw_avx(auVar1,0,3);
        uVar9 = pmaddwd(uVar10,auVar1._0_8_);
        auVar1 = vpinsrw_avx(ZEXT216(0x70),0xffa2,1);
        auVar1 = vpinsrw_avx(auVar1,0xffee,2);
        auVar1 = vpinsrw_avx(auVar1,0,3);
        uVar10 = pmaddwd(uVar10,auVar1._0_8_);
        local_3b0 = (int)uVar8;
        iStack_2ec = (int)((ulong)uVar8 >> 0x20);
        local_3c0 = (int)uVar9;
        iStack_2fc = (int)((ulong)uVar9 >> 0x20);
        local_3d0 = (int)uVar10;
        iStack_30c = (int)((ulong)uVar10 >> 0x20);
        local_3d0 = local_3d0 + iStack_30c;
        auVar1 = vpinsrd_avx(ZEXT416((uint)(local_3b0 + iStack_2ec)),local_3c0 + iStack_2fc,1);
        auVar3 = vpinsrd_avx(ZEXT416(0x80),0x80,1);
        auVar2 = vpinsrd_avx(ZEXT416(0x10),0x80,1);
        local_95c = (auVar1._0_4_ + auVar3._0_4_ >> 8) + auVar2._0_4_;
        local_964 = (auVar1._4_4_ + auVar3._4_4_ >> 8) + auVar2._4_4_;
        if (local_95c < 0) {
          local_958 = '\0';
        }
        else {
          if (0xff < local_95c) {
            local_95c = 0xff;
          }
          local_958 = (char)local_95c;
        }
        if (local_964 < 0) {
          local_960 = '\0';
        }
        else {
          if (0xff < local_964) {
            local_964 = 0xff;
          }
          local_960 = (char)local_964;
        }
        if ((local_3d0 + 0x80 >> 8) + 0x80 < 0) {
          local_968 = '\0';
        }
        else {
          if ((local_3d0 + 0x80 >> 8) + 0x80 < 0x100) {
            local_96c = (char)((uint)(local_3d0 + 0x80) >> 8) + -0x80;
          }
          else {
            local_96c = -1;
          }
          local_968 = local_96c;
        }
        result[local_78c][0][iVar5] = local_958;
        result[local_78c][1][(local_794 / 2) * 0x3c0 + local_798 / 2] = local_960;
        result[local_78c][2][(local_794 / 2) * 0x3c0 + local_798 / 2] = local_968;
      }
    }
  }
  if (pvVar7 != (void *)0x0) {
    operator_delete__(pvVar7);
  }
  return;
}

Assistant:

void MMXProcessor() {
    auto *data = new __m64[size];
    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            auto yi = (uint8_t) y[i][j];
            auto ui = (uint8_t) u[i / 2][j / 2];
            auto vi = (uint8_t) v[i / 2][j / 2];
            __m64 yuv = _mm_setr_pi16(16, 128, 128, 0);
            yuv = _mm_sub_pi16(_mm_setr_pi16(yi, ui, vi, 0), yuv);
            __m64 r = _mm_madd_pi16(yuv, _mm_setr_pi16(298, 0, 409, 0));
            __m64 g = _mm_madd_pi16(yuv, _mm_setr_pi16(298, -100, -208, 0));
            __m64 b = _mm_madd_pi16(yuv, _mm_setr_pi16(298, 516, 0, 0));
            int rr = (_mm_cvtsi64_si32(r) + int(_mm_cvtm64_si64(r) >> 32));
            int gg = (_mm_cvtsi64_si32(g) + int(_mm_cvtm64_si64(g) >> 32));
            int bb = (_mm_cvtsi64_si32(b) + int(_mm_cvtm64_si64(b) >> 32));
            __m64 val = _mm_setr_pi32(rr, gg);
            val = _mm_add_pi32(val, _mm_setr_pi32(128, 128));
            val = _mm_srai_pi32(val, 8);
            int ri = between(_mm_cvtsi64_si32(val));
            int gi = between(int(_mm_cvtm64_si64(val)>>32));
            int bi = between((bb + 128) >> 8);
            data[i * width + j] = _mm_setr_pi16(ri, gi, bi, 0);
        }
    }
    for (int num = 0; num < frame_num; num++) {
        int a = num * 3 + 1;
        for (int i = 0; i < height; i++) {
            for (int j = 0; j < width; j++) {
                int offset = i * width + j;
                __m64 rgb = _mm_srli_pi16(_mm_mullo_pi16(data[offset], _mm_set1_pi16(a)), 8);
                __m64 yi = (_mm_madd_pi16(rgb, _mm_setr_pi16(66, 129, 25, 0)));
                __m64 ui = (_mm_madd_pi16(rgb, _mm_setr_pi16(-38, -74, 112, 0)));
                __m64 vi = (_mm_madd_pi16(rgb, _mm_setr_pi16(112, -94, -18, 0)));
                int yy = (_mm_cvtsi64_si32(yi) + int(_mm_cvtm64_si64(yi) >> 32));
                int uu = (_mm_cvtsi64_si32(ui) + int(_mm_cvtm64_si64(ui) >> 32));
                int vv = (_mm_cvtsi64_si32(vi) + int(_mm_cvtm64_si64(vi) >> 32));
                __m64 val = _mm_setr_pi32(yy, uu);
                val = _mm_add_pi32(val, _mm_setr_pi32(128, 128));
                val = _mm_srai_pi32(val, 8);
                val = _mm_add_pi32(val, _mm_setr_pi32(16, 128));
                int ri = between(_mm_cvtsi64_si32(val));
                int gi = between(int(_mm_cvtm64_si64(val)>>32));
                int bi = between(((vv + 128) >> 8) + 128);
                result[num][0][offset] = ri;
                result[num][1][(i / 2) * (width / 2) + j / 2] = gi;
                result[num][2][(i / 2) * (width / 2) + j / 2] = bi;
            }
        }
    }
    delete[] data;
}